

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sovr.h
# Opt level: O0

vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
* sovr(vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
       *__return_storage_ptr__,int c,int r,
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      *mcurrent,vector<float,_std::allocator<float>_> *x,int m)

{
  value_type vVar1;
  float fVar2;
  bool bVar3;
  byte bVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  ostream *poVar9;
  long local_270;
  ofstream file_stream;
  float local_5c;
  undefined1 local_58 [4];
  float sum;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  temp;
  int local_38;
  int n;
  int k;
  int j;
  int i;
  int m_local;
  vector<float,_std::allocator<float>_> *x_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *mcurrent_local;
  int r_local;
  int c_local;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *current;
  
  makeMatrix((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)local_58,r,c);
  for (local_38 = 1; local_38 < c + -1; local_38 = local_38 + r + 1) {
    for (k = 0; k < r; k = k + 1) {
      for (n = 0; n < r; n = n + 1) {
        pvVar5 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](mcurrent,(long)k);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)(n + local_38));
        if (*pvVar6 == 1) {
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](x,(long)(local_38 / r));
          vVar1 = *pvVar7;
          pvVar8 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                 *)local_58,(long)k);
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                             (pvVar8,(long)(n + local_38));
          *pvVar7 = vVar1;
        }
        else {
          pvVar5 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](mcurrent,(long)k);
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)(n + local_38));
          if (*pvVar6 == -1) {
            pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](x,(long)(local_38 / r));
            vVar1 = *pvVar7;
            pvVar8 = std::
                     vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                   *)local_58,(long)k);
            pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                               (pvVar8,(long)(n + local_38));
            *pvVar7 = -vVar1;
          }
          else {
            pvVar8 = std::
                     vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                   *)local_58,(long)k);
            pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                               (pvVar8,(long)(n + local_38));
            *pvVar7 = 0.0;
          }
        }
      }
    }
  }
  for (k = 0; k < r; k = k + 1) {
    for (n = 0; n < r + 1; n = n + 1) {
      for (local_38 = 1; local_38 < m; local_38 = local_38 + 1) {
        pvVar8 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               *)local_58,(long)k);
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                           (pvVar8,(long)(n + local_38 * (r + 1)));
        fVar2 = *pvVar7;
        pvVar8 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               *)local_58,(long)k);
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,(long)n);
        *pvVar7 = fVar2 + *pvVar7;
      }
    }
  }
  makeMatrix(__return_storage_ptr__,r,r);
  for (k = 0; k < r; k = k + 1) {
    for (n = 0; n < r; n = n + 1) {
      pvVar8 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             *)local_58,(long)k);
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,(long)(n + 1));
      vVar1 = *pvVar7;
      pvVar8 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](__return_storage_ptr__,(long)k);
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,(long)n);
      *pvVar7 = vVar1;
    }
  }
  bVar3 = false;
  k = 0;
  do {
    if (r <= k) {
LAB_00103b42:
      if (!bVar3) {
        std::operator<<((ostream *)&std::cout,"\nComputed currents fit the law of nodes\n");
      }
      for (k = 0; k < r; k = k + 1) {
        for (n = 0; n < r; n = n + 1) {
          pvVar8 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[](__return_storage_ptr__,(long)k);
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,(long)n);
          if (*pvVar7 <= 0.0) {
            pvVar8 = std::
                     vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ::operator[](__return_storage_ptr__,(long)k);
            pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,(long)n);
            *pvVar7 = 0.0;
          }
        }
      }
      std::ofstream::ofstream(&local_270,"current.dat",0x10);
      std::operator<<((ostream *)&local_270,
                      "The current matrix stores the currents between nodes in the circuit.\n");
      std::operator<<((ostream *)&local_270,
                      "Entry with (row, column) indexes (A, B) identifies a current flowing from node A to node B, while the corresponding (B, A) entry is empty.\n"
                     );
      std::operator<<((ostream *)&local_270,"Current matrix: \n");
      for (k = 0; k < r; k = k + 1) {
        for (n = 0; n < r + -1; n = n + 1) {
          pvVar8 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[](__return_storage_ptr__,(long)k);
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,(long)n);
          poVar9 = (ostream *)std::ostream::operator<<(&local_270,*pvVar7);
          std::operator<<(poVar9,"\t");
        }
        pvVar8 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[](__return_storage_ptr__,(long)k);
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,(long)(r + -1));
        poVar9 = (ostream *)std::ostream::operator<<(&local_270,*pvVar7);
        std::operator<<(poVar9,"\n");
      }
      bVar4 = std::ios::operator!((ios *)((long)&local_270 + *(long *)(local_270 + -0x18)));
      if ((bVar4 & 1) == 0) {
        std::operator<<((ostream *)&std::cout,"File current.dat has been written\n");
      }
      else {
        std::operator<<((ostream *)&std::cout,"Error in writing file current.data\n");
      }
      std::ofstream::~ofstream(&local_270);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 *)local_58);
      return __return_storage_ptr__;
    }
    local_5c = 0.0;
    for (n = 0; n < r; n = n + 1) {
      pvVar8 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](__return_storage_ptr__,(long)k);
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,(long)n);
      local_5c = *pvVar7 + local_5c;
    }
    if ((0.0001 <= local_5c) && (local_5c <= -0.0001)) {
      std::operator<<((ostream *)&std::cout,"\n There was an error while calculating currents\n");
      bVar3 = true;
      goto LAB_00103b42;
    }
    k = k + 1;
  } while( true );
}

Assistant:

auto sovr(int c, int r, std::vector<std::vector<int> > &mcurrent, std::vector<float> &x, int m)
{
    int i, j, k, n;
    using std::vector;
    auto temp = makeMatrix(r, c);
    float sum;

    // multiply the  temp matrix by the values of the mesh currents in each individual mesh
    for (k = 1; k < c-1; k = k + r + 1)
    {
        for ( i = 0; i < r; i++)
        {
            for (j = 0; j < r; j++)
            {
                if(mcurrent[i][j+k] == 1)
                {
                    temp[i][j+k] = x[k/r];
                } else if (mcurrent[i][j+k] == -1)
                {
                    temp[i][j+k] = -x[k/r];
                } else
                {
                    temp[i][j+k] = 0;
                }

            }
        }
    }

    for (i = 0; i < r; i++)
    {
        for (j = 0; j < r + 1 ; j++)
        {
            for (k = 1; k < m; k++)
            {
                temp[i][j] +=  + temp[i][j+k*(r+1)];
            }
        }
    }

    auto current = makeMatrix(r, r);

    for (i = 0; i < r; i++)
    {
        for (j = 0; j < r; j++)
        {
            current[i][j] = temp[i][j+1];
        }
    }

    //Check that the results are correct by applying the law of nodes (and angles)
    // note that the law of the nodes is verified if the sum of the terms on each row is 0 (4.d.p)
    k = 0;
    for (i = 0; i < r; i++)
    {
        sum = 0;
        for (j = 0; j < r; j++)
        {
            sum += current[i][j];
        }
        if (sum >= 0.0001 && sum <= -0.0001)
        {
            std::cout << "\n There was an error while calculating currents\n";
            k = 1;
            break;
        }
    }
    if(k==0)
    {
        std::cout << "\nComputed currents fit the law of nodes\n";
    }

    for (i = 0; i < r; i++)
    {
        for (j = 0; j < r; j++)
        {
            if (current[i][j] <= 0)
            {
                current[i][j] = 0;
            }
        }
    }

    std::ofstream file_stream("current.dat");
    file_stream << "The current matrix stores the currents between nodes in the circuit.\n";
    file_stream << "Entry with (row, column) indexes (A, B) identifies a current flowing from node A to node B, while the corresponding (B, A) entry is empty.\n";
    file_stream << "Current matrix: \n";

    for (i = 0; i < r; i++)
    {
        for (j = 0; j < r - 1; j++)
        {
            file_stream << current[i][j] << "\t";
        }
        file_stream << current[i][r-1] << "\n";
    }

    if (!file_stream)
    {
        std::cout << "Error in writing file current.data\n";
    } else {
        std::cout << "File current.dat has been written\n";
    }

    return current;
}